

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::~mipmapped_texture(mipmapped_texture *this)

{
  char *pcVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  void *p;
  long lVar3;
  ulong uVar4;
  
  free_all_mips(this);
  pcVar1 = (this->m_last_error).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  pvVar2 = (this->m_faces).m_p;
  if (pvVar2 != (vector<crnlib::mip_level_*> *)0x0) {
    uVar4 = (ulong)(this->m_faces).m_size;
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        p = *(void **)((long)&pvVar2->m_p + lVar3);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar4 << 4 != lVar3);
    }
    crnlib_free((this->m_faces).m_p);
  }
  pcVar1 = (this->m_name).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  return;
}

Assistant:

mipmapped_texture::~mipmapped_texture() {
  free_all_mips();
}